

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::BuiltInResource,_8UL>::push_back
          (SmallVector<diligent_spirv_cross::BuiltInResource,_8UL> *this,BuiltInResource *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  BuiltInResource *pBVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined8 uVar6;
  TypeID TVar7;
  BuiltInResource *pBVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  reserve(this,(this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size + 1);
  pBVar3 = (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).ptr;
  sVar4 = (this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size;
  TVar7.id = (t->value_type_id).id;
  pBVar8 = pBVar3 + sVar4;
  paVar9 = &(pBVar8->resource).name.field_2;
  pBVar8->builtin = t->builtin;
  pBVar8->value_type_id = (TypeID)TVar7.id;
  TVar7.id = (t->resource).type_id.id;
  (pBVar8->resource).id = (ID)(t->resource).id.id;
  (pBVar8->resource).type_id = (TypeID)TVar7.id;
  (pBVar8->resource).base_type_id.id = (t->resource).base_type_id.id;
  (pBVar8->resource).name._M_dataplus._M_p = (pointer)paVar9;
  pcVar5 = (t->resource).name._M_dataplus._M_p;
  paVar1 = &(t->resource).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(t->resource).name.field_2 + 8);
    paVar9->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(pBVar8->resource).name.field_2 + 8) = uVar6;
  }
  else {
    pBVar3[sVar4].resource.name._M_dataplus._M_p = pcVar5;
    pBVar3[sVar4].resource.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pBVar3[sVar4].resource.name._M_string_length = (t->resource).name._M_string_length;
  (t->resource).name._M_dataplus._M_p = (pointer)paVar1;
  (t->resource).name._M_string_length = 0;
  (t->resource).name.field_2._M_local_buf[0] = '\0';
  psVar2 = &(this->super_VectorView<diligent_spirv_cross::BuiltInResource>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}